

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O1

bool tinyusdz::pathutil::ValidatePropPath(Path *path,string *err)

{
  string *psVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  psVar1 = &path->_prop_part;
  iVar3 = ::std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 == 0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar6 = (char *)err->_M_string_length;
    pcVar5 = "Proparty path is composed of namespace delimiter only(`:`).";
  }
  else {
    local_50 = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,":","");
    if ((path->_prop_part)._M_string_length < local_48) {
      bVar7 = false;
    }
    else if (local_48 == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = bcmp(local_50,(psVar1->_M_dataplus)._M_p,local_48);
      bVar7 = iVar3 == 0;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar7) {
      if (err == (string *)0x0) {
        return false;
      }
      pcVar6 = (char *)err->_M_string_length;
      pcVar5 = "Property path starts with namespace delimiter(`:`).";
    }
    else {
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,":","");
      uVar2 = (path->_prop_part)._M_string_length;
      if (uVar2 < local_48) {
        bVar7 = false;
      }
      else {
        lVar4 = ::std::__cxx11::string::find((char *)psVar1,(ulong)local_50,uVar2 - local_48);
        bVar7 = lVar4 != -1;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar7) {
        if (err == (string *)0x0) {
          return false;
        }
        pcVar6 = (char *)err->_M_string_length;
        pcVar5 = "Property path ends with namespace delimiter(`:`).";
      }
      else {
        local_50 = local_40;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"::","");
        lVar4 = ::std::__cxx11::string::find((char *)psVar1,(ulong)local_50,0);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (lVar4 == -1) {
          return true;
        }
        if (err == (string *)0x0) {
          return false;
        }
        pcVar6 = (char *)err->_M_string_length;
        pcVar5 = "Empty path among namespace delimiters(`::`) in Property path.";
      }
    }
  }
  ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar6,(ulong)pcVar5);
  return false;
}

Assistant:

bool ValidatePropPath(const Path &path, std::string *err) {
  if (path.prop_part() == ":") {
    if (err) {
      (*err) = "Proparty path is composed of namespace delimiter only(`:`).";
    }
    return false;
  }

  if (startsWith(path.prop_part(), ":")) {
    if (err) {
      (*err) = "Property path starts with namespace delimiter(`:`).";
    }
    return false;
  }

  if (endsWith(path.prop_part(), ":")) {
    if (err) {
      (*err) = "Property path ends with namespace delimiter(`:`).";
    }
    return false;
  }

  if (contains_str(path.prop_part(), "::")) {
    if (err) {
      (*err) = "Empty path among namespace delimiters(`::`) in Property path.";
    }
    return false;
  }

  // TODO: more validation

  return true;

}